

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O2

void __thiscall Dir::Dir(Dir *this,string *path)

{
  DIR *pDVar1;
  runtime_error *this_00;
  int *in_R9;
  char local_44 [4];
  string local_40;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  pDVar1 = opendir((path->_M_dataplus)._M_p);
  this->dir_ = (DIR *)pDVar1;
  if (pDVar1 != (DIR *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_44[0] = '\b';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  util::str<char[39],char[85],char[2],int>
            (&local_40,(util *)"Assertion `dir_ != nullptr` failed at ",
             (char (*) [39])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lib/dir.cc",
             (char (*) [85])":",(char (*) [2])local_44,in_R9);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Dir::Dir(const std::string& path)
    : path_(path) {
  dir_ = opendir(path.c_str());
  ASSERT(dir_ != nullptr);
}